

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_set_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,size_t nb1,size_t nb2,size_t nb3,
             size_t offset,_Bool inplace)

{
  ggml_tensor *tensor;
  char *pcVar1;
  int line;
  int32_t params [5];
  
  if (a->ne[1] * a->ne[0] * a->ne[2] * a->ne[3] < b->ne[1] * b->ne[0] * b->ne[2] * b->ne[3]) {
    pcVar1 = "ggml_nelements(a) >= ggml_nelements(b)";
    line = 0xb3e;
  }
  else {
    if (inplace) {
      tensor = ggml_view_tensor(ctx,a);
    }
    else {
      tensor = ggml_dup_tensor(ctx,a);
    }
    if (offset < 0x40000000) {
      params[0] = (int32_t)nb1;
      params[1] = (int32_t)nb2;
      params[2] = (int32_t)nb3;
      params[3] = (int32_t)offset;
      params[4] = (int32_t)inplace;
      ggml_set_op_params(tensor,params,0x14);
      tensor->op = GGML_OP_SET;
      tensor->src[0] = a;
      tensor->src[1] = b;
      return tensor;
    }
    pcVar1 = "offset < (size_t)(1 << 30)";
    line = 0xb43;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",line,
             "GGML_ASSERT(%s) failed",pcVar1);
}

Assistant:

static struct ggml_tensor * ggml_set_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        size_t                nb1,
        size_t                nb2,
        size_t                nb3,
        size_t                offset,
        bool                  inplace) {
    GGML_ASSERT(ggml_nelements(a) >= ggml_nelements(b));

    // make a view of the destination
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    GGML_ASSERT(offset < (size_t)(1 << 30));
    int32_t params[] = { nb1, nb2, nb3, offset, inplace ? 1 : 0 };
    ggml_set_op_params(result, params, sizeof(params));

    result->op     = GGML_OP_SET;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}